

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O0

LOs __thiscall
Omega_h::get_verts_onto(Omega_h *this,Mesh *mesh,LOs *rails2edges,Read<signed_char> *rail_col_dirs)

{
  LO size_in;
  void *extraout_RDX;
  LOs LVar1;
  Write<int> local_f8;
  undefined1 local_e8 [8];
  type set_key_onto;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  Write<int> keys2verts_onto_w;
  LOs ev2v;
  LO nkeys;
  Read<signed_char> *rail_col_dirs_local;
  LOs *rails2edges_local;
  Mesh *mesh_local;
  ulong local_10;
  
  if (((ulong)(rails2edges->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((rails2edges->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(rails2edges->write_).shared_alloc_.alloc >> 3;
  }
  size_in = (LO)(local_10 >> 2);
  Mesh::ask_verts_of((Mesh *)&keys2verts_onto_w.shared_alloc_.direct_ptr,(Int)mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  Write<int>::Write((Write<int> *)local_70,size_in,-1,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  Read<int>::Read((Read<int> *)local_e8,rails2edges);
  Read<signed_char>::Read
            ((Read<signed_char> *)&set_key_onto.rails2edges.write_.shared_alloc_.direct_ptr,
             rail_col_dirs);
  Write<int>::Write((Write<int> *)&set_key_onto.rail_col_dirs.write_.shared_alloc_.direct_ptr,
                    (Write<int> *)local_70);
  Read<int>::Read((Read<int> *)&set_key_onto.keys2verts_onto_w.shared_alloc_.direct_ptr,
                  (Read<int> *)&keys2verts_onto_w.shared_alloc_.direct_ptr);
  parallel_for<Omega_h::get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::__0>
            (size_in,(type *)local_e8,"get_verts_onto");
  Write<int>::Write(&local_f8,(Write<int> *)local_70);
  Read<int>::Read((Read<int> *)this,&local_f8);
  Write<int>::~Write(&local_f8);
  get_verts_onto(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)local_e8);
  Write<int>::~Write((Write<int> *)local_70);
  Read<int>::~Read((Read<int> *)&keys2verts_onto_w.shared_alloc_.direct_ptr);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs get_verts_onto(Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs) {
  auto nkeys = rails2edges.size();
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto keys2verts_onto_w = Write<LO>(nkeys, -1);
  auto set_key_onto = OMEGA_H_LAMBDA(LO key) {
    auto e = rails2edges[key];
    auto eev = rail_col_dirs[key];
    keys2verts_onto_w[key] = ev2v[e * 2 + (1 - eev)];
  };
  parallel_for(nkeys, set_key_onto, "get_verts_onto");
  return keys2verts_onto_w;
}